

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

BlockEntry * __thiscall mkvparser::Segment::GetBlock(Segment *this,CuePoint *cp,TrackPosition *tp)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Segment *pSegment;
  longlong lVar3;
  BlockEntry *pBVar4;
  Cluster *pCVar5;
  Cluster *in_RDX;
  Segment *in_RSI;
  long in_RDI;
  ptrdiff_t idx;
  Cluster *pCluster;
  longlong pos;
  Cluster *pCluster_1;
  Cluster **k;
  Cluster **j;
  Cluster **jj;
  long count;
  Cluster **i;
  Cluster **ii;
  Cluster *in_stack_ffffffffffffffb0;
  Cluster *idx_00;
  Cluster *local_30;
  Cluster *idx_01;
  
  local_30 = *(Cluster **)(in_RDI + 0xa8);
  pSegment = (Segment *)(*(long *)(in_RDI + 0xb0) + *(long *)(in_RDI + 0xb8));
  idx_00 = (Cluster *)(&local_30->m_pSegment + (long)pSegment);
  pCVar5 = idx_00;
  idx_01 = local_30;
  while (local_30 < pCVar5) {
    auVar1._8_8_ = (long)pCVar5 - (long)local_30 >> 0x3f;
    auVar1._0_8_ = (long)pCVar5 - (long)local_30 >> 3;
    in_stack_ffffffffffffffb0 = (Cluster *)(&local_30->m_pSegment + SUB168(auVar1 / SEXT816(2),0));
    lVar3 = Cluster::GetPosition((Cluster *)in_stack_ffffffffffffffb0->m_pSegment);
    if (lVar3 < in_RDX->m_element_start) {
      local_30 = (Cluster *)&in_stack_ffffffffffffffb0->m_element_start;
    }
    else {
      pCVar5 = in_stack_ffffffffffffffb0;
      if (lVar3 <= in_RDX->m_element_start) {
        pBVar4 = Cluster::GetEntry((Cluster *)pos,(CuePoint *)pCluster,(TrackPosition *)idx);
        return pBVar4;
      }
    }
  }
  pCVar5 = Cluster::Create(pSegment,(long)idx_00,(longlong)pCVar5);
  if (pCVar5 == (Cluster *)0x0) {
    return (BlockEntry *)0x0;
  }
  bVar2 = PreloadCluster(in_RSI,in_RDX,(ptrdiff_t)idx_01);
  if (!bVar2) {
    if (pCVar5 != (Cluster *)0x0) {
      Cluster::~Cluster(in_stack_ffffffffffffffb0);
      operator_delete(pCVar5);
    }
    return (BlockEntry *)0x0;
  }
  pBVar4 = Cluster::GetEntry((Cluster *)pos,(CuePoint *)pCluster,(TrackPosition *)idx);
  return pBVar4;
}

Assistant:

const BlockEntry* Segment::GetBlock(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) {
  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < tp.m_pos)
      i = k + 1;
    else if (pos > tp.m_pos)
      j = k;
    else
      return pCluster->GetEntry(cp, tp);
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, tp.m_pos);  //, -1);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster->GetEntry(cp, tp);
}